

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

SimpleDictionaryUnorderedTypeHandler<unsigned_short,_const_Js::PropertyRecord_*,_true> * __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true>::
ConvertToSimpleDictionaryUnorderedTypeHandler<unsigned_short,Js::PropertyRecord_const*,true>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true> *this,
          DynamicObject *instance)

{
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SimpleDictionaryUnorderedTypeHandler<unsigned_short,_const_Js::PropertyRecord_*,_true> *this_01;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *pSVar4;
  int i;
  int index;
  
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x23b,"(instance)","instance");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_01 = ConvertToTypeHandler<Js::SimpleDictionaryUnorderedTypeHandler<unsigned_short,Js::PropertyRecord_const*,true>,Js::PropertyRecord_const*>
                      (this,instance);
  if (((byte)this[0x28] & 2) == 0) {
    for (index = 0;
        this_00 = *(BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                    **)(this + 0x18), index < this_00->count - this_00->freeCount; index = index + 1
        ) {
      pSVar4 = JsUtil::
               BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
               ::GetValueAt(this_00,index);
      if ((pSVar4->Attributes & 8) != 0) {
        SimpleDictionaryUnorderedTypeHandler<unsigned_short,_const_Js::PropertyRecord_*,_true>::
        TryRegisterDeletedPropertyIndex(this_01,instance,pSVar4->propertyIndex);
      }
    }
  }
  else if (*(short *)(this + 0x2c) != -1) {
    *(short *)&(this_01->
               super_SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>
               ).field_0x2c = *(short *)(this + 0x2c);
  }
  return this_01;
}

Assistant:

SimpleDictionaryUnorderedTypeHandler<NewTPropertyIndex, NewTMapKey, NewIsNotExtensibleSupported>* SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::ConvertToSimpleDictionaryUnorderedTypeHandler(DynamicObject* instance)
    {
        CompileAssert(sizeof(NewTPropertyIndex) >= sizeof(TPropertyIndex));
        Assert(instance);

        SimpleDictionaryUnorderedTypeHandler<NewTPropertyIndex, NewTMapKey, NewIsNotExtensibleSupported> *const newTypeHandler =
            ConvertToTypeHandler<SimpleDictionaryUnorderedTypeHandler<NewTPropertyIndex, NewTMapKey, NewIsNotExtensibleSupported>, NewTMapKey>(instance);

        if(isUnordered)
        {
            newTypeHandler->CopyUnorderedStateFrom(*AsUnordered(), instance);
        }
        else
        {
            for(int i = 0; i < propertyMap->Count(); ++i)
            {
                SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor(propertyMap->GetValueAt(i));
                if(descriptor.Attributes & PropertyDeleted)
                {
                    newTypeHandler->TryRegisterDeletedPropertyIndex(instance, descriptor.propertyIndex);
                }
            }
        }

        return newTypeHandler;
    }